

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O1

void __thiscall
llama_model_loader::llama_model_loader
          (llama_model_loader *this,string *fname,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *splits,bool use_mmap,bool check_tensors,llama_model_kv_override *param_overrides_p,
          llama_model_tensor_buft_override *param_tensor_buft_overrides_p)

{
  uint64_t *puVar1;
  LLM_KV *pLVar2;
  char *pcVar3;
  pointer pbVar4;
  _Rb_tree_color _Var5;
  unsigned_short uVar6;
  _Alloc_hider _Var7;
  gguf_context_ptr *pgVar8;
  int *piVar9;
  bool bVar10;
  ushort uVar11;
  int iVar12;
  llm_arch arch;
  llama_fver lVar13;
  undefined4 uVar14;
  char *pcVar15;
  size_t sVar16;
  pointer __p;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  ggml_tensor *pgVar18;
  iterator iVar19;
  long lVar20;
  size_t __n;
  mapped_type *pmVar21;
  undefined8 uVar22;
  ulong uVar23;
  _Base_ptr p_Var24;
  undefined8 uVar25;
  runtime_error *prVar26;
  undefined8 uVar27;
  undefined7 in_register_00000009;
  llama_ftype lVar28;
  mapped_type mVar29;
  string *psVar30;
  undefined7 in_register_00000081;
  uint uVar31;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar32;
  uint32_t ftype_val;
  ggml_context *ctx;
  vector<char,_std::allocator<char>_> buf;
  string kv_split_no;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
  *__range1;
  string split_prefix;
  __hashtable *__h;
  unsigned_short local_26c;
  unsigned_short local_26a;
  llama_model_loader *local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  LLM_KV *local_240;
  gguf_context_ptr *local_238;
  undefined4 local_230;
  allocator_type local_229;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_228;
  _Base_ptr local_220;
  ggml_context *local_218;
  string local_210;
  string local_1f0;
  string *local_1d0;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>,std::_Select1st<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>,llama_model_loader::weight_name_comparer,std::allocator<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>>
  *local_1c8;
  undefined4 local_1bc;
  undefined1 local_1b8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  vector<std::unique_ptr<ggml_context,ggml_context_deleter>,std::allocator<std::unique_ptr<ggml_context,ggml_context_deleter>>>
  *local_180;
  vector<std::unique_ptr<llama_file,std::default_delete<llama_file>>,std::allocator<std::unique_ptr<llama_file,std::default_delete<llama_file>>>>
  *local_178;
  undefined4 local_16c;
  undefined1 local_168 [8];
  pointer pbStack_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Rb_tree_node_base *local_148;
  size_t local_140;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,llama_model_kv_override>,std::allocator<std::pair<std::__cxx11::string_const,llama_model_kv_override>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_40;
  int *local_38;
  
  local_16c = (undefined4)CONCAT71(in_register_00000081,check_tensors);
  local_1bc = (undefined4)CONCAT71(in_register_00000009,use_mmap);
  this->n_kv = 0;
  this->n_tensors = 0;
  this->n_created = 0;
  local_178 = (vector<std::unique_ptr<llama_file,std::default_delete<llama_file>>,std::allocator<std::unique_ptr<llama_file,std::default_delete<llama_file>>>>
               *)&this->files;
  (this->files).
  super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->files).
  super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->files).
  super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mappings).
  super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mappings).
  super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mappings).
  super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>,std::_Select1st<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>,llama_model_loader::weight_name_comparer,std::allocator<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>>
               *)&this->weights_map;
  local_220 = &(this->weights_map)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->weights_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->weights_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->n_elements = 0;
  this->n_bytes = 0;
  this->use_mmap = false;
  (this->weights_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_220;
  (this->weights_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_220;
  (this->weights_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,llama_model_kv_override>,std::allocator<std::pair<std::__cxx11::string_const,llama_model_kv_override>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->kv_overrides;
  (this->kv_overrides)._M_h._M_buckets = &(this->kv_overrides)._M_h._M_single_bucket;
  (this->kv_overrides)._M_h._M_bucket_count = 1;
  (this->kv_overrides)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->kv_overrides)._M_h._M_element_count = 0;
  (this->kv_overrides)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->kv_overrides)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->kv_overrides)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_238 = &this->meta;
  local_180 = (vector<std::unique_ptr<ggml_context,ggml_context_deleter>,std::allocator<std::unique_ptr<ggml_context,ggml_context_deleter>>>
               *)&this->contexts;
  local_188 = &this->arch_name;
  local_190 = &(this->arch_name).field_2;
  (this->contexts).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->contexts).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->meta)._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
  super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
  super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl = (gguf_context *)0x0;
  (this->contexts).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arch_name)._M_dataplus._M_p = (pointer)local_190;
  (this->arch_name)._M_string_length = 0;
  (this->arch_name).field_2._M_local_buf[0] = '\0';
  pLVar2 = &this->llm_kv;
  LLM_KV::LLM_KV(pLVar2,LLM_ARCH_UNKNOWN,(char *)0x0);
  (this->mmaps_used).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mmaps_used).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->size_done = 0;
  this->size_data = 0;
  (this->mmaps_used).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268 = this;
  pcVar15 = getenv("LLAMA_TRACE");
  local_240 = pLVar2;
  local_228 = splits;
  local_1d0 = fname;
  if (pcVar15 == (char *)0x0) {
    local_230 = 0;
  }
  else {
    iVar12 = atoi(pcVar15);
    local_230 = CONCAT31((int3)((uint)iVar12 >> 8),0 < iVar12);
  }
  if ((param_overrides_p != (llama_model_kv_override *)0x0) && (param_overrides_p->key[0] != '\0'))
  {
    pcVar15 = param_overrides_p->key;
    paVar17 = &local_260.field_2;
    do {
      local_260._M_dataplus._M_p = (pointer)paVar17;
      sVar16 = strlen(pcVar15);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,pcVar15,pcVar15 + sVar16)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p == paVar17) {
        local_158._8_8_ = local_260.field_2._8_8_;
        local_168 = (undefined1  [8])&local_158;
      }
      else {
        local_168 = (undefined1  [8])local_260._M_dataplus._M_p;
      }
      local_158._M_allocated_capacity._1_7_ = local_260.field_2._M_allocated_capacity._1_7_;
      local_158._M_local_buf[0] = local_260.field_2._M_local_buf[0];
      pbStack_160 = (pointer)local_260._M_string_length;
      local_260._M_string_length = 0;
      local_260.field_2._M_local_buf[0] = '\0';
      local_260._M_dataplus._M_p = (pointer)paVar17;
      memcpy(&local_148,(llama_model_kv_override *)(pcVar15 + -4),0x108);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,llama_model_kv_override>,std::allocator<std::pair<std::__cxx11::string_const,llama_model_kv_override>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string_const,llama_model_kv_override>>
                (local_40,local_168);
      if (local_168 != (undefined1  [8])&local_158) {
        operator_delete((void *)local_168,(ulong)(local_158._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar17) {
        operator_delete(local_260._M_dataplus._M_p,
                        CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                 local_260.field_2._M_local_buf[0]) + 1);
      }
      pcVar3 = pcVar15 + 0x108;
      pcVar15 = pcVar15 + 0x108;
    } while (*pcVar3 != '\0');
  }
  psVar30 = local_1d0;
  pgVar8 = local_238;
  local_268->tensor_buft_overrides = param_tensor_buft_overrides_p;
  local_218 = (ggml_context *)0x0;
  __p = (pointer)gguf_init_from_file((local_1d0->_M_dataplus)._M_p,1);
  pLVar2 = local_240;
  std::__uniq_ptr_impl<gguf_context,_gguf_context_deleter>::reset
            ((__uniq_ptr_impl<gguf_context,_gguf_context_deleter> *)pgVar8,__p);
  if ((pgVar8->_M_t).super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
      super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
      super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl == (gguf_context *)0x0) {
    prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
    format_abi_cxx11_((string *)local_168,"%s: failed to load model from %s\n","llama_model_loader",
                      (psVar30->_M_dataplus)._M_p);
    std::runtime_error::runtime_error(prVar26,(string *)local_168);
    __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  LLM_KV::operator()[abi_cxx11_((string *)local_168,pLVar2,LLM_KV_GENERAL_ARCHITECTURE);
  get_key<std::__cxx11::string>(local_268,(string *)local_168,local_188,false);
  if (local_168 != (undefined1  [8])&local_158) {
    operator_delete((void *)local_168,(ulong)(local_158._M_allocated_capacity + 1));
  }
  arch = llm_arch_from_string(local_188);
  LLM_KV::LLM_KV((LLM_KV *)local_168,arch,(char *)0x0);
  *(undefined1 (*) [8])pLVar2 = local_168;
  pLVar2->suffix = (char *)pbStack_160;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)operator_new(8);
  llama_file::llama_file
            ((llama_file *)&paVar17->_M_allocated_capacity,(psVar30->_M_dataplus)._M_p,"rb");
  local_168 = (undefined1  [8])paVar17;
  std::
  vector<std::unique_ptr<llama_file,std::default_delete<llama_file>>,std::allocator<std::unique_ptr<llama_file,std::default_delete<llama_file>>>>
  ::emplace_back<llama_file*>(local_178,(llama_file **)local_168);
  std::
  vector<std::unique_ptr<ggml_context,ggml_context_deleter>,std::allocator<std::unique_ptr<ggml_context,ggml_context_deleter>>>
  ::emplace_back<ggml_context*&>(local_180,&local_218);
  pgVar18 = (ggml_tensor *)ggml_get_first_tensor(local_218);
  local_38 = &local_268->n_tensors;
  puVar1 = &local_268->n_elements;
  for (; pLVar2 = local_240, pgVar18 != (ggml_tensor *)0x0;
      pgVar18 = (ggml_tensor *)ggml_get_next_tensor(local_218,pgVar18)) {
    local_168 = (undefined1  [8])&local_158;
    sVar16 = strlen(pgVar18->name);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,pgVar18->name,pgVar18->name + sVar16);
    iVar19 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
                     *)local_1c8,(key_type *)local_168);
    if (iVar19._M_node != local_220) {
      prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
      uVar27 = ggml_get_name(pgVar18);
      format_abi_cxx11_(&local_260,"invalid model: tensor \'%s\' is duplicated",uVar27);
      std::runtime_error::runtime_error(prVar26,(string *)&local_260);
      __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar20 = ggml_nelements(pgVar18);
    *puVar1 = *puVar1 + lVar20;
    lVar20 = ggml_nbytes(pgVar18);
    local_268->n_bytes = local_268->n_bytes + lVar20;
    llama_tensor_weight::llama_tensor_weight
              ((llama_tensor_weight *)&local_260,
               (local_268->files).
               super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>._M_t.
               super__Tuple_impl<0UL,_llama_file_*,_std::default_delete<llama_file>_>.
               super__Head_base<0UL,_llama_file_*,_false>._M_head_impl,0,
               (local_268->meta)._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t
               .super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
               super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,pgVar18);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>,std::_Select1st<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>,llama_model_loader::weight_name_comparer,std::allocator<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>>
    ::_M_emplace_unique<std::__cxx11::string&,llama_model_loader::llama_tensor_weight>
              (local_1c8,(key_type *)local_168,(llama_tensor_weight *)&local_260);
    if (local_168 != (undefined1  [8])&local_158) {
      operator_delete((void *)local_168,(ulong)(local_158._M_allocated_capacity + 1));
    }
  }
  local_26a = 0;
  LLM_KV::operator()[abi_cxx11_((string *)local_168,local_240,LLM_KV_SPLIT_COUNT);
  get_key<unsigned_short>(local_268,(string *)local_168,&local_26a,false);
  if (local_168 != (undefined1  [8])&local_158) {
    operator_delete((void *)local_168,(ulong)(local_158._M_allocated_capacity + 1));
  }
  if (1 < local_26a) {
    local_26c = 0;
    LLM_KV::operator()[abi_cxx11_(&local_1f0,pLVar2,LLM_KV_SPLIT_NO);
    get_key<unsigned_short>(local_268,&local_1f0,&local_26c,true);
    uVar6 = local_26a;
    uVar31 = (uint)local_26c;
    if (local_26c != 0) {
      prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_((string *)local_168,
                        "illegal split file idx: %d (file: %s), model must be loaded with the first split"
                        ,(ulong)local_26c,(psVar30->_M_dataplus)._M_p);
      std::runtime_error::runtime_error(prVar26,(string *)local_168);
      __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar32 = local_228;
    if ((local_228->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (local_228->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      local_1b8._0_8_ = (pointer)0x0;
      local_1b8._8_8_ = (pointer)0x0;
      local_1b8._16_8_ = (pointer)0x0;
      local_168 = (undefined1  [8])&local_158;
      pbStack_160 = (pointer)0x0;
      local_158._M_allocated_capacity = local_158._M_allocated_capacity & 0xffffffffffffff00;
      __n = llama_path_max();
      local_260._M_dataplus._M_p = local_260._M_dataplus._M_p & 0xffffffffffffff00;
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&local_210,__n,(value_type *)&local_260,
                 &local_229);
      iVar12 = llama_split_prefix(local_210._M_dataplus._M_p,
                                  local_210._M_string_length - (long)local_210._M_dataplus._M_p,
                                  (local_1d0->_M_dataplus)._M_p,uVar31,(uint)uVar6);
      if (iVar12 == 0) {
        prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
        format_abi_cxx11_(&local_260,"invalid split file name: %s",(local_1d0->_M_dataplus)._M_p);
        std::runtime_error::runtime_error(prVar26,(string *)&local_260);
        __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      paVar17 = &local_260.field_2;
      local_260._M_dataplus._M_p = (pointer)paVar17;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_260,local_210._M_dataplus._M_p,
                 (gguf_context *)(local_210._M_dataplus._M_p + iVar12));
      std::__cxx11::string::operator=((string *)local_168,(string *)&local_260);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar17) {
        operator_delete(local_260._M_dataplus._M_p,
                        CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                 local_260.field_2._M_local_buf[0]) + 1);
      }
      if (pbStack_160 == (pointer)0x0) {
        prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
        format_abi_cxx11_(&local_260,"invalid split file: %s",(local_1d0->_M_dataplus)._M_p);
        std::runtime_error::runtime_error(prVar26,(string *)&local_260);
        __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (uVar6 != 0) {
        uVar31 = 0;
        do {
          iVar12 = llama_split_path(local_210._M_dataplus._M_p,
                                    local_210._M_string_length - (long)local_210._M_dataplus._M_p,
                                    (char *)local_168,uVar31,(uint)uVar6);
          local_260._M_dataplus._M_p = (pointer)paVar17;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_260,local_210._M_dataplus._M_p,
                     (gguf_context *)(local_210._M_dataplus._M_p + iVar12));
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_1b8,
                     &local_260);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != paVar17) {
            operator_delete(local_260._M_dataplus._M_p,
                            CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                     local_260.field_2._M_local_buf[0]) + 1);
          }
          uVar31 = uVar31 + 1;
        } while (uVar6 != uVar31);
      }
      if ((gguf_context *)local_210._M_dataplus._M_p != (gguf_context *)0x0) {
        operator_delete(local_210._M_dataplus._M_p,
                        local_210.field_2._M_allocated_capacity - (long)local_210._M_dataplus._M_p);
      }
      pvVar32 = local_228;
      if (local_168 != (undefined1  [8])&local_158) {
        operator_delete((void *)local_168,local_158._M_allocated_capacity + 1);
      }
      local_168 = (undefined1  [8])
                  (pvVar32->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      pbStack_160 = (pvVar32->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
      local_158._M_allocated_capacity =
           (size_type)
           (pvVar32->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pvVar32->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)local_1b8._0_8_;
      (pvVar32->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1b8._8_8_;
      (pvVar32->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1b8._16_8_;
      local_1b8._0_8_ = (pointer)0x0;
      local_1b8._8_8_ = (pointer)0x0;
      local_1b8._16_8_ = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_168);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1b8);
    }
    if (local_26a !=
        (ushort)((uint)(*(int *)&(pvVar32->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                       *(int *)&(pvVar32->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 5)) {
      prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_((string *)local_168,
                        "invalid split count, given: %zu splits, but expected %d",
                        (long)(local_228->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_228->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5,(ulong)local_26a);
      std::runtime_error::runtime_error(prVar26,(string *)local_168);
      __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((char)local_230 != '\0') {
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: loading additional %d GGUFs\n",
                         "llama_model_loader");
    }
    local_26c = 1;
    if (1 < local_26a) {
      do {
        pcVar15 = (local_228->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[local_26c]._M_dataplus._M_p;
        local_210._M_dataplus._M_p = (pointer)gguf_init_from_file(pcVar15,1,&local_218);
        if ((gguf_context *)local_210._M_dataplus._M_p == (gguf_context *)0x0) {
          prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
          format_abi_cxx11_((string *)local_168,"%s: failed to load GGUF split from %s\n",
                            "llama_model_loader",pcVar15);
          std::runtime_error::runtime_error(prVar26,(string *)local_168);
          __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar31 = gguf_find_key(local_210._M_dataplus._M_p,
                               CONCAT44(local_1f0._M_dataplus._M_p._4_4_,
                                        (ggml_type)local_1f0._M_dataplus._M_p));
        if ((int)uVar31 < 0) {
          prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
          format_abi_cxx11_((string *)local_168,"missing key %s in GGUF split %s",
                            CONCAT44(local_1f0._M_dataplus._M_p._4_4_,
                                     (ggml_type)local_1f0._M_dataplus._M_p),pcVar15);
          std::runtime_error::runtime_error(prVar26,(string *)local_168);
          __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar11 = gguf_get_val_u16(local_210._M_dataplus._M_p,uVar31 & 0x7fffffff);
        if (uVar11 != local_26c) {
          prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
          format_abi_cxx11_((string *)local_168,"invalid split file idx: %d (file: %s), expected %d"
                            ,(ulong)uVar11,pcVar15,(ulong)local_26c);
          std::runtime_error::runtime_error(prVar26,(string *)local_168);
          __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)operator_new(8);
        llama_file::llama_file((llama_file *)&paVar17->_M_allocated_capacity,pcVar15,"rb");
        local_168 = (undefined1  [8])paVar17;
        std::
        vector<std::unique_ptr<llama_file,std::default_delete<llama_file>>,std::allocator<std::unique_ptr<llama_file,std::default_delete<llama_file>>>>
        ::emplace_back<llama_file*>(local_178,(llama_file **)local_168);
        std::
        vector<std::unique_ptr<ggml_context,ggml_context_deleter>,std::allocator<std::unique_ptr<ggml_context,ggml_context_deleter>>>
        ::emplace_back<ggml_context*&>(local_180,&local_218);
        for (pgVar18 = (ggml_tensor *)ggml_get_first_tensor(local_218);
            pgVar18 != (ggml_tensor *)0x0;
            pgVar18 = (ggml_tensor *)ggml_get_next_tensor(local_218,pgVar18)) {
          local_168 = (undefined1  [8])&local_158;
          sVar16 = strlen(pgVar18->name);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_168,pgVar18->name,pgVar18->name + sVar16);
          iVar19 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
                           *)local_1c8,(key_type *)local_168);
          if (iVar19._M_node != local_220) {
            prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
            uVar27 = ggml_get_name(pgVar18);
            format_abi_cxx11_(&local_260,"invalid model: tensor \'%s\' is duplicated",uVar27);
            std::runtime_error::runtime_error(prVar26,(string *)&local_260);
            __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          lVar20 = ggml_nelements(pgVar18);
          *puVar1 = *puVar1 + lVar20;
          lVar20 = ggml_nbytes(pgVar18);
          local_268->n_bytes = local_268->n_bytes + lVar20;
          llama_tensor_weight::llama_tensor_weight
                    ((llama_tensor_weight *)&local_260,
                     (local_268->files).
                     super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                     super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>._M_t.
                     super__Tuple_impl<0UL,_llama_file_*,_std::default_delete<llama_file>_>.
                     super__Head_base<0UL,_llama_file_*,_false>._M_head_impl,local_26c,
                     (gguf_context *)local_210._M_dataplus._M_p,pgVar18);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>,std::_Select1st<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>,llama_model_loader::weight_name_comparer,std::allocator<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>>
          ::_M_emplace_unique<std::__cxx11::string&,llama_model_loader::llama_tensor_weight>
                    (local_1c8,(key_type *)local_168,(llama_tensor_weight *)&local_260);
          if (local_168 != (undefined1  [8])&local_158) {
            operator_delete((void *)local_168,(ulong)(local_158._M_allocated_capacity + 1));
          }
        }
        std::unique_ptr<gguf_context,_gguf_context_deleter>::~unique_ptr
                  ((unique_ptr<gguf_context,_gguf_context_deleter> *)&local_210);
        local_26c = local_26c + 1;
      } while (local_26c < local_26a);
    }
    LLM_KV::operator()[abi_cxx11_((string *)local_168,local_240,LLM_KV_SPLIT_TENSORS_COUNT);
    piVar9 = local_38;
    get_key<int>(local_268,(string *)local_168,local_38,true);
    if (local_168 != (undefined1  [8])&local_158) {
      operator_delete((void *)local_168,(ulong)(local_158._M_allocated_capacity + 1));
    }
    uVar31 = (uint)(local_268->weights_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (local_268->n_tensors != uVar31) {
      prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_((string *)local_168,"corrupted model: %d tensors expected but %d found",
                        (ulong)(uint)*piVar9,(ulong)uVar31);
      std::runtime_error::runtime_error(prVar26,(string *)local_168);
      __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: additional %d GGUFs metadata loaded.\n",
                       "llama_model_loader",(ulong)(local_26a - 1));
    psVar30 = local_1d0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1f0._M_dataplus._M_p._4_4_,(ggml_type)local_1f0._M_dataplus._M_p) !=
        &local_1f0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1f0._M_dataplus._M_p._4_4_,
                               (ggml_type)local_1f0._M_dataplus._M_p),
                      local_1f0.field_2._M_allocated_capacity + 1);
    }
  }
  iVar12 = gguf_get_n_kv((local_238->_M_t).super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>
                         ._M_t.super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                         super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl);
  local_268->n_kv = iVar12;
  local_268->n_tensors =
       (int)(local_268->weights_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  lVar13 = gguf_get_version((local_268->meta)._M_t.
                            super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                            super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl);
  local_268->fver = lVar13;
  if (lVar13 - GGUF_FILE_VERSION_V1 < 3) {
    pcVar15 = (&PTR_anon_var_dwarf_17c650_00287040)[lVar13 - GGUF_FILE_VERSION_V1];
  }
  else {
    pcVar15 = "unknown";
  }
  llama_log_internal(GGML_LOG_LEVEL_INFO,
                     "%s: loaded meta data with %d key-value pairs and %d tensors from %s (version %s)\n"
                     ,"llama_model_loader",(ulong)(uint)local_268->n_kv,
                     (ulong)(uint)local_268->n_tensors,(psVar30->_M_dataplus)._M_p,pcVar15);
  local_158._8_8_ = &pbStack_160;
  pbStack_160 = (pointer)((ulong)pbStack_160 & 0xffffffff00000000);
  local_158._M_allocated_capacity = 0;
  local_240 = (LLM_KV *)0x0;
  local_140 = 0;
  p_Var24 = (local_268->weights_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_148 = (_Rb_tree_node_base *)local_158._8_8_;
  if (p_Var24 != local_220) {
    local_240 = (LLM_KV *)0x0;
    mVar29 = 0;
    do {
      pgVar18 = (ggml_tensor *)p_Var24[2]._M_left;
      local_1f0._M_dataplus._M_p._0_4_ = pgVar18->type;
      pmVar21 = std::
                map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
                ::operator[]((map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
                              *)local_168,(key_type *)&local_1f0);
      *pmVar21 = *pmVar21 + 1;
      pmVar21 = std::
                map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
                ::operator[]((map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
                              *)local_168,(key_type *)&local_1f0);
      if (mVar29 < *pmVar21) {
        pmVar21 = std::
                  map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
                  ::operator[]((map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
                                *)local_168,(key_type *)&local_1f0);
        mVar29 = *pmVar21;
        local_240 = (LLM_KV *)(ulong)(ggml_type)local_1f0._M_dataplus._M_p;
      }
      if ((char)local_230 != '\0') {
        local_228 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(local_228._4_4_,mVar29);
        _Var5 = p_Var24[2]._M_color;
        uVar27 = ggml_get_name(pgVar18);
        uVar22 = ggml_type_name((ggml_type)local_1f0._M_dataplus._M_p);
        llama_format_tensor_shape_abi_cxx11_(&local_260,pgVar18);
        _Var7._M_p = local_260._M_dataplus._M_p;
        uVar23 = ggml_nbytes(pgVar18);
        llama_log_internal(GGML_LOG_LEVEL_INFO,
                           "%s: - tensor split %2d: %32s %-8s [ %s ] %8.2f MiB\n",
                           SUB84((double)((float)uVar23 * 0.0009765625 * 0.0009765625),0),
                           "llama_model_loader",(ulong)(ushort)(short)_Var5,uVar27,uVar22,_Var7._M_p
                          );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,
                          CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                   local_260.field_2._M_local_buf[0]) + 1);
        }
        mVar29 = (mapped_type)local_228;
      }
      p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24);
    } while (p_Var24 != local_220);
  }
  if (((uint)local_240 < 0x24) && ((0xc60ff7dcfU >> ((ulong)local_240 & 0x3f) & 1) != 0)) {
    lVar28 = *(llama_ftype *)(&DAT_0023b578 + ((ulong)local_240 & 0xffffffff) * 4) |
             LLAMA_FTYPE_GUESSED;
  }
  else {
    ggml_type_name();
    lVar28 = LLAMA_FTYPE_GUESSED;
    llama_log_internal(GGML_LOG_LEVEL_WARN,"%s: unknown type %s\n","llama_model_loader");
  }
  local_268->ftype = lVar28;
  local_260._M_dataplus._M_p = local_260._M_dataplus._M_p & 0xffffffff00000000;
  bVar10 = get_key<unsigned_int>(local_268,LLM_KV_GENERAL_FILE_TYPE,(uint *)&local_260,false);
  if (bVar10) {
    local_268->ftype = (llama_ftype)local_260._M_dataplus._M_p;
  }
  llama_log_internal(GGML_LOG_LEVEL_INFO,
                     "%s: Dumping metadata keys/values. Note: KV overrides do not apply in this output.\n"
                     ,"llama_model_loader");
  if (0 < local_268->n_kv) {
    pbVar4 = (pointer)(local_1b8 + 0x10);
    uVar23 = 0;
    do {
      pgVar8 = local_238;
      local_220 = (_Base_ptr)
                  gguf_get_key((local_238->_M_t).
                               super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                               super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                               super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,uVar23);
      iVar12 = gguf_get_kv_type((pgVar8->_M_t).
                                super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                                super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                                super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,uVar23);
      if (iVar12 == 9) {
        uVar27 = gguf_type_name(9);
        uVar14 = gguf_get_arr_type((local_238->_M_t).
                                   super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                                   super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                                   super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,uVar23)
        ;
        uVar22 = gguf_type_name(uVar14);
        uVar25 = gguf_get_arr_n((local_238->_M_t).
                                super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                                super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                                super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,uVar23);
        format_abi_cxx11_(&local_260,"%s[%s,%zu]",uVar27,uVar22,uVar25);
      }
      else {
        pcVar15 = (char *)gguf_type_name(iVar12);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_260,pcVar15,(allocator<char> *)&local_26c);
      }
      gguf_kv_to_str_abi_cxx11_
                (&local_1f0,
                 (local_238->_M_t).super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                 super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                 super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,(int)uVar23);
      paVar17 = &local_210.field_2;
      if (0x28 < local_1f0._M_string_length) {
        std::__cxx11::string::substr((ulong)local_1b8,(ulong)&local_1f0);
        format_abi_cxx11_(&local_210,"%s...",local_1b8._0_8_);
        std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar17) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_1b8._0_8_ != pbVar4) {
          operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
        }
      }
      local_210._M_dataplus._M_p = (pointer)paVar17;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"\n","");
      local_1b8._0_8_ = pbVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"\\n","");
      replace_all(&local_1f0,&local_210,(string *)local_1b8);
      if ((pointer)local_1b8._0_8_ != pbVar4) {
        operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar17) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: - kv %3d: %42s %-16s = %s\n","llama_model_loader",
                         uVar23 & 0xffffffff,local_220,local_260._M_dataplus._M_p,
                         CONCAT44(local_1f0._M_dataplus._M_p._4_4_,
                                  (ggml_type)local_1f0._M_dataplus._M_p));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1f0._M_dataplus._M_p._4_4_,(ggml_type)local_1f0._M_dataplus._M_p) !=
          &local_1f0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1f0._M_dataplus._M_p._4_4_,
                                 (ggml_type)local_1f0._M_dataplus._M_p),
                        local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,
                        CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                 local_260.field_2._M_local_buf[0]) + 1);
      }
      uVar23 = uVar23 + 1;
    } while ((long)uVar23 < (long)local_268->n_kv);
  }
  uVar27 = local_158._8_8_;
  if ((_Rb_tree_node_base *)local_158._8_8_ != (_Rb_tree_node_base *)&pbStack_160) {
    do {
      if (*(int *)&((_Rb_tree_node_base *)(uVar27 + 0x20))->field_0x4 != 0) {
        uVar22 = ggml_type_name(((_Rb_tree_node_base *)(uVar27 + 0x20))->_M_color);
        llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: - type %4s: %4d tensors\n","llama_model_loader",
                           uVar22,(ulong)*(uint *)&((_Rb_tree_node_base *)(uVar27 + 0x20))->
                                                   field_0x4);
      }
      uVar27 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar27);
    } while ((_Rb_tree_node_base *)uVar27 != (_Rb_tree_node_base *)&pbStack_160);
  }
  std::
  _Rb_tree<ggml_type,_std::pair<const_ggml_type,_unsigned_int>,_std::_Select1st<std::pair<const_ggml_type,_unsigned_int>_>,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<ggml_type,_std::pair<const_ggml_type,_unsigned_int>,_std::_Select1st<std::pair<const_ggml_type,_unsigned_int>_>,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
               *)local_168);
  local_268->use_mmap = SUB41(local_1bc,0);
  local_268->check_tensors = SUB41(local_16c,0);
  return;
}

Assistant:

llama_model_loader::llama_model_loader(
        const std::string & fname,
        std::vector<std::string> & splits,
        bool use_mmap,
        bool check_tensors,
        const llama_model_kv_override * param_overrides_p,
        const llama_model_tensor_buft_override * param_tensor_buft_overrides_p) {
    int trace = 0;
    if (getenv("LLAMA_TRACE")) {
        trace = atoi(getenv("LLAMA_TRACE"));
    }

    if (param_overrides_p != nullptr) {
        for (const struct llama_model_kv_override * p = param_overrides_p; p->key[0] != 0; p++) {
            kv_overrides.insert({std::string(p->key), *p});
        }
    }

    tensor_buft_overrides = param_tensor_buft_overrides_p;

    // Load the main GGUF
    struct ggml_context * ctx = NULL;
    struct gguf_init_params params = {
        /*.no_alloc = */ true,
        /*.ctx      = */ &ctx,
    };

    meta.reset(gguf_init_from_file(fname.c_str(), params));
    if (!meta) {
        throw std::runtime_error(format("%s: failed to load model from %s\n", __func__, fname.c_str()));
    }

    get_key(llm_kv(LLM_KV_GENERAL_ARCHITECTURE), arch_name, false);
    llm_kv = LLM_KV(llm_arch_from_string(arch_name));

    files.emplace_back(new llama_file(fname.c_str(), "rb"));
    contexts.emplace_back(ctx);

    // Save tensors data offset of the main file.
    // For subsidiary files, `meta` tensor data offset must not be used,
    // so we build a unified tensors index for weights.
    for (ggml_tensor * cur = ggml_get_first_tensor(ctx); cur; cur = ggml_get_next_tensor(ctx, cur)) {
        std::string tensor_name = std::string(cur->name);
        // make sure there is no duplicated tensor names
        if (weights_map.find(tensor_name) != weights_map.end()) {
            throw std::runtime_error(format("invalid model: tensor '%s' is duplicated", ggml_get_name(cur)));
        }
        n_elements += ggml_nelements(cur);
        n_bytes    += ggml_nbytes(cur);
        weights_map.emplace(tensor_name, llama_tensor_weight(files.back().get(), 0, meta.get(), cur));
    }
    uint16_t n_split = 0;
    get_key(llm_kv(LLM_KV_SPLIT_COUNT), n_split, false);

    // Load additional GGML contexts
    if (n_split > 1) {
        // make sure the main file is loaded first
        uint16_t idx = 0;
        const std::string kv_split_no = llm_kv(LLM_KV_SPLIT_NO);
        get_key(kv_split_no, idx);
        if (idx != 0) {
            throw std::runtime_error(format("illegal split file idx: %d (file: %s), model must be loaded with the first split", idx, fname.c_str()));
        }

        // generate list of splits if needed
        if (splits.empty()) {
            splits = llama_get_list_splits(fname, idx, n_split);
        }

        // in case user give a custom list of splits, check if it matches the expected number
        if (n_split != (uint16_t)splits.size()) {
            throw std::runtime_error(format("invalid split count, given: %zu splits, but expected %d", splits.size(), n_split));
        }

        if (trace > 0) {
            LLAMA_LOG_INFO("%s: loading additional %d GGUFs\n", __func__, n_split);
        }

        // load other splits
        for (idx = 1; idx < n_split; idx++) {
            const char * fname_split = splits[idx].c_str();

            struct gguf_init_params split_params = {
                /*.no_alloc = */ true,
                /*.ctx      = */ &ctx,
            };
            gguf_context_ptr ctx_gguf { gguf_init_from_file(fname_split, split_params) };
            if (!ctx_gguf) {
                throw std::runtime_error(format("%s: failed to load GGUF split from %s\n", __func__, fname_split));
            }

            // check idx
            {
                const int kid = gguf_find_key(ctx_gguf.get(), kv_split_no.c_str());
                if (kid < 0) {
                    throw std::runtime_error(format("missing key %s in GGUF split %s", kv_split_no.c_str(), fname_split));
                }
                int idx_gguf = gguf_get_val_u16(ctx_gguf.get(), kid);
                if (idx_gguf != idx) {
                    throw std::runtime_error(format("invalid split file idx: %d (file: %s), expected %d", idx_gguf, fname_split, idx));
                }
            }

            files.emplace_back(new llama_file(fname_split, "rb"));
            contexts.emplace_back(ctx);

            // Save tensors data offset info of the shard.
            for (ggml_tensor * cur = ggml_get_first_tensor(ctx); cur; cur = ggml_get_next_tensor(ctx, cur)) {
                std::string tensor_name = std::string(cur->name);
                // make sure there is no duplicated tensor names
                if (weights_map.find(tensor_name) != weights_map.end()) {
                    throw std::runtime_error(format("invalid model: tensor '%s' is duplicated", ggml_get_name(cur)));
                }
                n_elements += ggml_nelements(cur);
                n_bytes    += ggml_nbytes(cur);
                weights_map.emplace(tensor_name, llama_tensor_weight(files.back().get(), idx, ctx_gguf.get(), cur));
            }
        }

        get_key(llm_kv(LLM_KV_SPLIT_TENSORS_COUNT), n_tensors);

        // sanity check
        {
            const int n_tensors_loaded = (int) weights_map.size();
            if (n_tensors != n_tensors_loaded) {
                throw std::runtime_error(format("corrupted model: %d tensors expected but %d found", n_tensors, n_tensors_loaded));
            }
        }

        LLAMA_LOG_INFO("%s: additional %d GGUFs metadata loaded.\n",  __func__, n_split - 1);
    }

    n_kv      = gguf_get_n_kv(meta.get());
    n_tensors = weights_map.size();

    fver = (enum llama_fver) gguf_get_version(meta.get());

    LLAMA_LOG_INFO("%s: loaded meta data with %d key-value pairs and %d tensors from %s (version %s)\n",
            __func__, n_kv, n_tensors, fname.c_str(), llama_file_version_name(fver));

    // determine file type based on the number of tensors for each quantization and print meta data
    // TODO: make optional
    {
        std::map<enum ggml_type, uint32_t> n_type;

        uint32_t n_type_max = 0;
        enum ggml_type type_max = GGML_TYPE_F32;

        for (const auto & it : weights_map) {
            const llama_tensor_weight & w = it.second;
            const ggml_tensor * tensor = w.tensor;

            enum ggml_type type = tensor->type;

            n_type[type]++;

            if (n_type_max < n_type[type]) {
                n_type_max = n_type[type];
                type_max   = type;
            }

            if (trace > 0) {
                const uint16_t sid = w.idx;
                LLAMA_LOG_INFO("%s: - tensor split %2d: %32s %-8s [ %s ] %8.2f MiB\n", __func__,
                        sid, ggml_get_name(tensor), ggml_type_name(type), llama_format_tensor_shape(tensor).c_str(),
                        ggml_nbytes(tensor)/1024.0f/1024.0f);
            }
        }

        switch (type_max) {
            case GGML_TYPE_F32:     ftype = LLAMA_FTYPE_ALL_F32;        break;
            case GGML_TYPE_F16:     ftype = LLAMA_FTYPE_MOSTLY_F16;     break;
            case GGML_TYPE_BF16:    ftype = LLAMA_FTYPE_MOSTLY_BF16;    break;
            case GGML_TYPE_Q4_0:    ftype = LLAMA_FTYPE_MOSTLY_Q4_0;    break;
            case GGML_TYPE_Q4_1:    ftype = LLAMA_FTYPE_MOSTLY_Q4_1;    break;
            case GGML_TYPE_Q5_0:    ftype = LLAMA_FTYPE_MOSTLY_Q5_0;    break;
            case GGML_TYPE_Q5_1:    ftype = LLAMA_FTYPE_MOSTLY_Q5_1;    break;
            case GGML_TYPE_Q8_0:    ftype = LLAMA_FTYPE_MOSTLY_Q8_0;    break;
            case GGML_TYPE_Q2_K:    ftype = LLAMA_FTYPE_MOSTLY_Q2_K;    break;
            case GGML_TYPE_Q3_K:    ftype = LLAMA_FTYPE_MOSTLY_Q3_K_M;  break;
            case GGML_TYPE_Q4_K:    ftype = LLAMA_FTYPE_MOSTLY_Q4_K_M;  break;
            case GGML_TYPE_Q5_K:    ftype = LLAMA_FTYPE_MOSTLY_Q5_K_M;  break;
            case GGML_TYPE_Q6_K:    ftype = LLAMA_FTYPE_MOSTLY_Q6_K;    break;
            case GGML_TYPE_TQ1_0:   ftype = LLAMA_FTYPE_MOSTLY_TQ1_0;   break;
            case GGML_TYPE_TQ2_0:   ftype = LLAMA_FTYPE_MOSTLY_TQ2_0;   break;
            case GGML_TYPE_IQ2_XXS: ftype = LLAMA_FTYPE_MOSTLY_IQ2_XXS; break;
            case GGML_TYPE_IQ2_XS:  ftype = LLAMA_FTYPE_MOSTLY_IQ2_XS;  break;
            case GGML_TYPE_IQ2_S:   ftype = LLAMA_FTYPE_MOSTLY_IQ2_S;   break;
            case GGML_TYPE_IQ3_XXS: ftype = LLAMA_FTYPE_MOSTLY_IQ3_XXS; break;
            case GGML_TYPE_IQ1_S:   ftype = LLAMA_FTYPE_MOSTLY_IQ1_S;   break;
            case GGML_TYPE_IQ1_M:   ftype = LLAMA_FTYPE_MOSTLY_IQ1_M;   break;
            case GGML_TYPE_IQ4_NL:  ftype = LLAMA_FTYPE_MOSTLY_IQ4_NL;  break;
            case GGML_TYPE_IQ4_XS:  ftype = LLAMA_FTYPE_MOSTLY_IQ4_XS;  break;
            case GGML_TYPE_IQ3_S:   ftype = LLAMA_FTYPE_MOSTLY_IQ3_S;   break;
            default:
                {
                    LLAMA_LOG_WARN("%s: unknown type %s\n", __func__, ggml_type_name(type_max));
                    ftype = LLAMA_FTYPE_ALL_F32;
                } break;
        }

        // this is a way to mark that we have "guessed" the file type
        ftype = (llama_ftype) (ftype | LLAMA_FTYPE_GUESSED);

        {
            uint32_t ftype_val = 0;
            if (get_key(LLM_KV_GENERAL_FILE_TYPE, ftype_val, false)) {
                ftype = (llama_ftype) ftype_val;
            }
        }

        LLAMA_LOG_INFO("%s: Dumping metadata keys/values. Note: KV overrides do not apply in this output.\n", __func__);

        for (int i = 0; i < n_kv; i++) {
            const char * name           = gguf_get_key(meta.get(), i);
            const enum gguf_type type   = gguf_get_kv_type(meta.get(), i);
            const std::string type_name =
                type == GGUF_TYPE_ARRAY
                ? format("%s[%s,%zu]", gguf_type_name(type), gguf_type_name(gguf_get_arr_type(meta.get(), i)), gguf_get_arr_n(meta.get(), i))
                : gguf_type_name(type);

            std::string value          = gguf_kv_to_str(meta.get(), i);
            const size_t MAX_VALUE_LEN = 40;
            if (value.size() > MAX_VALUE_LEN) {
                value = format("%s...", value.substr(0, MAX_VALUE_LEN - 3).c_str());
            }
            replace_all(value, "\n", "\\n");

            LLAMA_LOG_INFO("%s: - kv %3d: %42s %-16s = %s\n", __func__, i, name, type_name.c_str(), value.c_str());
        }

        // print type counts
        for (auto & kv : n_type) {
            if (kv.second == 0) {
                continue;
            }

            LLAMA_LOG_INFO("%s: - type %4s: %4d tensors\n", __func__, ggml_type_name(kv.first), kv.second);
        }
    }

    if (!llama_mmap::SUPPORTED) {
        LLAMA_LOG_WARN("%s: mmap is not supported on this platform\n", __func__);
        use_mmap = false;
    }

    this->use_mmap = use_mmap;
    this->check_tensors = check_tensors;
}